

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_Look2(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  FState *pFVar1;
  AActor *pAVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  bool local_67;
  TFlags<ActorFlag4,_unsigned_int> local_64;
  TFlags<ActorFlag4,_unsigned_int> local_60;
  TFlags<ActorFlag,_unsigned_int> local_5c;
  TFlags<ActorFlag,_unsigned_int> local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  TFlags<ActorFlag,_unsigned_int> local_50;
  TFlags<ActorFlag5,_unsigned_int> local_4c;
  AActor *local_48;
  AActor *targ;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x925,"int AF_AActor_A_Look2(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar6) {
    targ = (AActor *)(param->field_0).field_1.a;
    local_67 = true;
    if (targ != (AActor *)0x0) {
      local_67 = DObject::IsKindOf((DObject *)targ,AActor::RegistrationInfo.MyClass);
    }
    if (local_67 != false) {
      TFlags<ActorFlag5,_unsigned_int>::operator&
                (&local_4c,
                 (int)targ +
                 (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
      if (uVar3 != 0) {
        return 0;
      }
      targ->threshold = 0;
      local_48 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&targ->LastHeard);
      if ((local_48 != (AActor *)0x0) && (local_48->health < 1)) {
        local_48 = (AActor *)0x0;
      }
      bVar6 = false;
      if (local_48 != (AActor *)0x0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_50,
                   (int)local_48 +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
        bVar6 = uVar3 != 0;
      }
      if (bVar6) {
        bVar6 = true;
        if ((level.flags & 0x20000000) == 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_54,
                     (int)targ +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_58,
                     (int)local_48 +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
          bVar6 = uVar3 != uVar4;
        }
        pAVar2 = targ;
        if (bVar6) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_5c,
                     (int)targ +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
          if ((uVar3 == 0) || (bVar6 = P_CheckSight(targ,local_48,4), bVar6)) {
            TObjPtr<AActor>::operator=(&targ->target,local_48);
            targ->threshold = 10;
            AActor::SetState(targ,targ->SeeState,false);
            return 0;
          }
        }
        else {
          TFlags<ActorFlag4,_unsigned_int>::operator&
                    (&local_60,
                     (int)targ +
                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
          uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
          bVar6 = P_LookForPlayers(pAVar2,uVar3,(FLookExParams *)0x0);
          if (((bVar6 ^ 0xffU) & 1) == 0) {
            AActor::SetState(targ,targ->SeeState,false);
            TFlags<ActorFlag4,_unsigned_int>::operator|=(&targ->flags4,MF4_INCOMBAT);
            return 0;
          }
        }
      }
      iVar5 = FRandom::operator()(&pr_look2);
      pAVar2 = targ;
      if (iVar5 < 0x1e) {
        pFVar1 = targ->SpawnState;
        uVar3 = FRandom::operator()(&pr_look2);
        AActor::SetState(pAVar2,pFVar1 + (long)(int)(uVar3 & 1) + 1,false);
      }
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_64,
                 (int)targ + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
      bVar6 = false;
      if (uVar3 == 0) {
        iVar5 = FRandom::operator()(&pr_look2);
        bVar6 = iVar5 < 0x28;
      }
      if (bVar6) {
        AActor::SetState(targ,targ->SpawnState + 3,false);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x925,"int AF_AActor_A_Look2(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x925,"int AF_AActor_A_Look2(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look2)
{
	PARAM_SELF_PROLOGUE(AActor);

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	self->threshold = 0;
	targ = self->LastHeard;

	if (targ != NULL && targ->health <= 0)
	{
		targ = NULL;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if ((level.flags & LEVEL_NOALLIES) ||
			(self->flags & MF_FRIENDLY) != (targ->flags & MF_FRIENDLY))
		{
			if (self->flags & MF_AMBUSH)
			{
				if (!P_CheckSight (self, targ, SF_SEEPASTBLOCKEVERYTHING))
					goto nosee;
			}
			self->target = targ;
			self->threshold = 10;
			self->SetState (self->SeeState);
			return 0;
		}
		else
		{
			if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto nosee;
			self->SetState (self->SeeState);
			self->flags4 |= MF4_INCOMBAT;
			return 0;
		}
	}
nosee:
	if (pr_look2() < 30)
	{
		self->SetState (self->SpawnState + (pr_look2() & 1) + 1);
	}
	if (!(self->flags4 & MF4_STANDSTILL) && pr_look2() < 40)
	{
		self->SetState (self->SpawnState + 3);
	}
	return 0;
}